

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::ParseUint64(char *s,char *end,uint64_t *out)

{
  bool bVar1;
  uint uVar2;
  uint32_t digit_1;
  uint64_t kMaxMod10;
  uint64_t kMaxDiv10;
  undefined8 uStack_40;
  uint32_t digit;
  uint64_t kMaxMod16;
  uint64_t kMaxDiv16;
  uint64_t value;
  uint64_t *out_local;
  char *end_local;
  char *s_local;
  
  value = (uint64_t)out;
  out_local = (uint64_t *)end;
  end_local = s;
  if (s == end) {
    Result::Result((Result *)((long)&s_local + 4),Error);
  }
  else {
    kMaxDiv16 = 0;
    if (((*s == '0') && (s + 1 < end)) && (s[1] == 'x')) {
      end_local = s + 2;
      if (end_local == end) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
      kMaxMod16 = 0xfffffffffffffff;
      uStack_40 = 0xf;
      for (; end_local < out_local; end_local = end_local + 1) {
        if (*end_local != '_') {
          kMaxDiv10._0_4_ = ParseHexdigit(*end_local,(uint32_t *)((long)&kMaxDiv10 + 4));
          bVar1 = Failed(kMaxDiv10._0_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&s_local + 4),Error);
            return (Result)s_local._4_4_;
          }
          if ((0xfffffffffffffff < kMaxDiv16) ||
             ((kMaxDiv16 == 0xfffffffffffffff && (0xf < kMaxDiv10._4_4_)))) {
            Result::Result((Result *)((long)&s_local + 4),Error);
            return (Result)s_local._4_4_;
          }
          kMaxDiv16 = kMaxDiv16 * 0x10 + (ulong)kMaxDiv10._4_4_;
        }
      }
    }
    else {
      for (; end_local < end; end_local = end_local + 1) {
        if (*end_local != '_') {
          uVar2 = (int)*end_local - 0x30;
          if (9 < uVar2) {
            Result::Result((Result *)((long)&s_local + 4),Error);
            return (Result)s_local._4_4_;
          }
          if ((0x1999999999999999 < kMaxDiv16) || ((kMaxDiv16 == 0x1999999999999999 && (5 < uVar2)))
             ) {
            Result::Result((Result *)((long)&s_local + 4),Error);
            return (Result)s_local._4_4_;
          }
          kMaxDiv16 = kMaxDiv16 * 10 + (ulong)uVar2;
        }
      }
    }
    if ((uint64_t *)end_local == out_local) {
      *(uint64_t *)value = kMaxDiv16;
      Result::Result((Result *)((long)&s_local + 4),Ok);
    }
    else {
      Result::Result((Result *)((long)&s_local + 4),Error);
    }
  }
  return (Result)s_local._4_4_;
}

Assistant:

Result ParseUint64(const char* s, const char* end, uint64_t* out) {
  if (s == end) {
    return Result::Error;
  }
  uint64_t value = 0;
  if (*s == '0' && s + 1 < end && s[1] == 'x') {
    s += 2;
    if (s == end) {
      return Result::Error;
    }
    constexpr uint64_t kMaxDiv16 = UINT64_MAX / 16;
    constexpr uint64_t kMaxMod16 = UINT64_MAX % 16;
    for (; s < end; ++s) {
      uint32_t digit;
      if (*s == '_') {
        continue;
      }
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      // Check for overflow.
      if (value > kMaxDiv16 || (value == kMaxDiv16 && digit > kMaxMod16)) {
        return Result::Error;
      }
      value = value * 16 + digit;
    }
  } else {
    constexpr uint64_t kMaxDiv10 = UINT64_MAX / 10;
    constexpr uint64_t kMaxMod10 = UINT64_MAX % 10;
    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit = (*s - '0');
      if (digit > 9) {
        return Result::Error;
      }
      // Check for overflow.
      if (value > kMaxDiv10 || (value == kMaxDiv10 && digit > kMaxMod10)) {
        return Result::Error;
      }
      value = value * 10 + digit;
    }
  }
  if (s != end) {
    return Result::Error;
  }
  *out = value;
  return Result::Ok;
}